

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_save.cpp
# Opt level: O1

void save_list_proc(ostream *os,Am_Load_Save_Context *context,Am_Value *value)

{
  bool bVar1;
  ostream *poVar2;
  Am_Value *value_00;
  Am_Value_List list;
  Am_Value_List local_30;
  
  Am_Load_Save_Context::Save_Type_Name(context,os,"Am_VALUE_LIST");
  Am_Value_List::Am_Value_List(&local_30,value);
  Am_Value_List::Length(&local_30);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  Am_Value_List::Start(&local_30);
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_30);
    if (bVar1) break;
    value_00 = Am_Value_List::Get(&local_30);
    Am_Load_Save_Context::Save(context,os,value_00);
    Am_Value_List::Next(&local_30);
  }
  Am_Value_List::~Am_Value_List(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Save_Method, void, save_list,
                 (std::ostream & os, Am_Load_Save_Context &context,
                  const Am_Value &value))
{
  context.Save_Type_Name(os, "Am_VALUE_LIST");
  Am_Value_List list = value;
  os << list.Length() << std::endl;
  for (list.Start(); !list.Last(); list.Next())
    context.Save(os, list.Get());
}